

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_length_range(ly_ctx *ctx,char *expr,lys_type *type)

{
  bool bVar1;
  int iVar2;
  ushort **ppuVar3;
  int local_44;
  int flg;
  int ret;
  char *tail;
  char *c;
  len_ran_intv *tmp_intv;
  len_ran_intv *intv;
  lys_type *type_local;
  char *expr_local;
  ly_ctx *ctx_local;
  
  tmp_intv = (len_ran_intv *)0x0;
  local_44 = 1;
  bVar1 = true;
  tail = expr;
  intv = (len_ran_intv *)type;
  type_local = (lys_type *)expr;
  expr_local = (char *)ctx;
  if (expr == (char *)0x0) {
    __assert_fail("expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x2c4,
                  "int lyp_check_length_range(struct ly_ctx *, const char *, struct lys_type *)");
  }
LAB_00131c8e:
  do {
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
      tail = tail + 1;
    }
    iVar2 = strncmp(tail,"max",3);
    if (iVar2 == 0) {
LAB_00131cd8:
      tail = tail + 3;
      while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
        tail = tail + 1;
      }
      if (*tail == '\0') {
LAB_00131fc6:
        iVar2 = resolve_len_ran_interval
                          ((ly_ctx *)expr_local,(char *)type_local,(lys_type *)intv,&tmp_intv);
        if (iVar2 == 0) {
          local_44 = 0;
        }
      }
LAB_00131feb:
      while (tmp_intv != (len_ran_intv *)0x0) {
        c = (char *)tmp_intv->next;
        free(tmp_intv);
        tmp_intv = (len_ran_intv *)c;
      }
      return local_44;
    }
    iVar2 = strncmp(tail,"min",3);
    if (iVar2 == 0) {
      if (!bVar1) goto LAB_00131feb;
      bVar1 = false;
      tail = tail + 3;
      while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
        tail = tail + 1;
      }
      if (*tail == '|') {
        tail = tail + 1;
        goto LAB_00131c8e;
      }
      if (*tail == '\0') goto LAB_00131fc6;
      iVar2 = strncmp(tail,"..",2);
      if (iVar2 == 0) {
LAB_00131de0:
        tail = tail + 2;
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
          tail = tail + 1;
        }
        if (*tail == '\0') goto LAB_00131feb;
        iVar2 = strncmp(tail,"max",3);
        if (iVar2 == 0) goto LAB_00131cd8;
        check_number(tail,(char **)&flg,*(LY_DATA_TYPE *)intv);
        if (tail == _flg) goto LAB_00131feb;
        tail = _flg;
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
          tail = tail + 1;
        }
        if (*tail == '\0') goto LAB_00131fc6;
        if (*tail != '|') goto LAB_00131feb;
        tail = tail + 1;
        goto LAB_00131c8e;
      }
      goto LAB_00131feb;
    }
    ppuVar3 = __ctype_b_loc();
    if ((((((*ppuVar3)[(int)*tail] & 0x800) == 0) && (*tail != '-')) && (*tail != '+')) ||
       (check_number(tail,(char **)&flg,*(LY_DATA_TYPE *)intv), tail == _flg)) goto LAB_00131feb;
    tail = _flg;
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*tail] & 0x2000) != 0) {
      tail = tail + 1;
    }
    if (*tail != '|') {
      if ((*tail != '\0') && (iVar2 = strncmp(tail,"..",2), iVar2 == 0)) goto LAB_00131de0;
      goto LAB_00131fc6;
    }
    tail = tail + 1;
  } while( true );
}

Assistant:

int
lyp_check_length_range(struct ly_ctx *ctx, const char *expr, struct lys_type *type)
{
    struct len_ran_intv *intv = NULL, *tmp_intv;
    const char *c = expr, *tail;
    int ret = EXIT_FAILURE, flg = 1; /* first run flag */

    assert(expr);

lengthpart:

    while (isspace(*c)) {
        c++;
    }

    /* lower boundary or explicit number */
    if (!strncmp(c, "max", 3)) {
max:
        c += 3;
        while (isspace(*c)) {
            c++;
        }
        if (*c != '\0') {
            goto error;
        }

        goto syntax_ok;

    } else if (!strncmp(c, "min", 3)) {
        if (!flg) {
            /* min cannot be used elsewhere than in the first length-part */
            goto error;
        } else {
            flg = 0;
        }
        c += 3;
        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
upper:
            c += 2;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto error;
            }

            /* upper boundary */
            if (!strncmp(c, "max", 3)) {
                goto max;
            }

            check_number(c, &tail, type->base);
            if (c == tail) {
                goto error;
            }
            c = tail;
            while (isspace(*c)) {
                c++;
            }
            if (*c == '\0') {
                goto syntax_ok;
            } else if (*c == '|') {
                c++;
                /* process next length-part */
                goto lengthpart;
            } else {
                goto error;
            }
        } else {
            goto error;
        }

    } else if (isdigit(*c) || (*c == '-') || (*c == '+')) {
        /* number */
        check_number(c, &tail, type->base);
        if (c == tail) {
            goto error;
        }
        c = tail;

        while (isspace(*c)) {
            c++;
        }

        if (*c == '|') {
            c++;
            /* process next length-part */
            goto lengthpart;
        } else if (*c == '\0') {
            goto syntax_ok;
        } else if (!strncmp(c, "..", 2)) {
            goto upper;
        }

    } else {
        goto error;
    }

syntax_ok:
    if (resolve_len_ran_interval(ctx, expr, type, &intv)) {
        goto error;
    }

    ret = EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    return ret;
}